

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yy_suffix(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *cclass;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *cclass_00;
  int yypos46;
  code *pcVar9;
  char *pcVar10;
  int yythunkpos0;
  int yypos0;
  int yythunkpos40;
  int yythunkpos46;
  
  iVar8 = G->pos;
  iVar7 = G->thunkpos;
  iVar3 = yy_identifier(G);
  if (iVar3 == 0) {
LAB_00103849:
    G->pos = iVar8;
    G->thunkpos = iVar7;
    iVar3 = yy_identifier(G);
    if (iVar3 == 0) {
LAB_001038a4:
      G->pos = iVar8;
      G->thunkpos = iVar7;
      iVar3 = yymatchChar(G,0x28);
      if (iVar3 == 0) {
        G->pos = iVar8;
        G->thunkpos = iVar7;
        pcVar10 = extraout_RDX;
      }
      else {
        yy__(G);
        iVar3 = yy_expression(G);
        pcVar10 = extraout_RDX_00;
        if (iVar3 != 0) {
          iVar3 = G->pos;
          iVar1 = G->thunkpos;
          iVar4 = yymatchChar(G,0x29);
          if (iVar4 != 0) {
            yy__(G);
            goto LAB_00103aba;
          }
          G->pos = iVar3;
          G->thunkpos = iVar1;
          pcVar10 = extraout_RDX_01;
        }
      }
      G->pos = iVar8;
      G->thunkpos = iVar7;
      iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
      pcVar10 = extraout_RDX_02;
      if (iVar3 == 0) {
LAB_001039e6:
        G->pos = iVar8;
        G->thunkpos = iVar7;
        iVar3 = yymatchClass(G,(uchar *)"",pcVar10);
        if (iVar3 != 0) {
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          pcVar10 = extraout_RDX_07;
          do {
            iVar3 = G->pos;
            iVar1 = G->thunkpos;
            iVar4 = yymatchClass(G,(uchar *)"",pcVar10);
            iVar6 = 10;
            if (iVar4 == 0) {
              G->pos = iVar3;
              G->thunkpos = iVar1;
              iVar6 = 0;
            }
            pcVar10 = extraout_RDX_08;
            if (iVar6 == 10) {
LAB_00103a5e:
              G->pos = iVar3;
              G->thunkpos = iVar1;
              iVar6 = 0;
            }
            else if (iVar6 == 0) {
              iVar4 = yy_char(G);
              iVar6 = 8;
              pcVar10 = extraout_RDX_09;
              if (iVar4 == 0) goto LAB_00103a5e;
            }
          } while (iVar6 != 0);
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          iVar3 = yymatchClass(G,(uchar *)"",cclass_00);
          if (iVar3 != 0) goto LAB_00103a96;
        }
        G->pos = iVar8;
        G->thunkpos = iVar7;
        iVar3 = yymatchChar(G,0x5b);
        if (iVar3 != 0) {
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          do {
            iVar3 = G->pos;
            iVar1 = G->thunkpos;
            iVar4 = yymatchChar(G,0x5d);
            iVar6 = 5;
            if (iVar4 == 0) {
              G->pos = iVar3;
              G->thunkpos = iVar1;
              iVar6 = 0;
            }
            if (iVar6 == 5) {
LAB_00103c88:
              G->pos = iVar3;
              G->thunkpos = iVar1;
              iVar6 = 0;
            }
            else if (iVar6 == 0) {
              iVar4 = G->pos;
              iVar2 = G->thunkpos;
              iVar6 = yy_char(G);
              if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x2d), iVar6 != 0)) {
                iVar5 = yy_char(G);
                iVar6 = 3;
                if (iVar5 != 0) goto LAB_00103c91;
              }
              G->pos = iVar4;
              G->thunkpos = iVar2;
              iVar5 = yy_char(G);
              iVar6 = 3;
              if (iVar5 == 0) {
                G->pos = iVar4;
                G->thunkpos = iVar2;
                goto LAB_00103c88;
              }
            }
LAB_00103c91:
          } while (iVar6 != 0);
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          iVar3 = yymatchChar(G,0x5d);
          if (iVar3 != 0) {
            yy__(G);
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_5_primary;
            pcVar10 = "yy_5_primary";
            goto LAB_00103ab2;
          }
        }
        G->pos = iVar8;
        G->thunkpos = iVar7;
        iVar3 = yymatchChar(G,0x2e);
        if (iVar3 == 0) {
          G->pos = iVar8;
          G->thunkpos = iVar7;
          G->pos = iVar8;
          G->thunkpos = iVar7;
          iVar3 = yy_action(G);
          if (iVar3 == 0) {
            G->pos = iVar8;
            G->thunkpos = iVar7;
            iVar3 = yy_BEGIN(G);
            if (iVar3 == 0) {
              G->pos = iVar8;
              G->thunkpos = iVar7;
              iVar3 = yy_END(G);
              if (iVar3 == 0) {
                G->pos = iVar8;
                G->thunkpos = iVar7;
                return 0;
              }
              iVar8 = G->begin;
              iVar7 = G->end;
              pcVar9 = yy_9_primary;
              pcVar10 = "yy_9_primary";
            }
            else {
              iVar8 = G->begin;
              iVar7 = G->end;
              pcVar9 = yy_8_primary;
              pcVar10 = "yy_8_primary";
            }
          }
          else {
            iVar8 = G->begin;
            iVar7 = G->end;
            pcVar9 = yy_7_primary;
            pcVar10 = "yy_7_primary";
          }
        }
        else {
          yy__(G);
          iVar8 = G->begin;
          iVar7 = G->end;
          pcVar9 = yy_6_primary;
          pcVar10 = "yy_6_primary";
        }
      }
      else {
        yyText(G,G->begin,G->end);
        G->begin = G->pos;
        pcVar10 = extraout_RDX_03;
        do {
          iVar3 = G->pos;
          iVar1 = G->thunkpos;
          iVar4 = yymatchClass(G,(uchar *)"",pcVar10);
          iVar6 = 5;
          if (iVar4 == 0) {
            G->pos = iVar3;
            G->thunkpos = iVar1;
            iVar6 = 0;
          }
          pcVar10 = extraout_RDX_04;
          if (iVar6 == 5) {
LAB_001039ae:
            G->pos = iVar3;
            G->thunkpos = iVar1;
            iVar6 = 0;
          }
          else if (iVar6 == 0) {
            iVar4 = yy_char(G);
            iVar6 = 3;
            pcVar10 = extraout_RDX_05;
            if (iVar4 == 0) goto LAB_001039ae;
          }
        } while (iVar6 != 0);
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        iVar3 = yymatchClass(G,(uchar *)"",cclass);
        pcVar10 = extraout_RDX_06;
        if (iVar3 == 0) goto LAB_001039e6;
LAB_00103a96:
        yy__(G);
        iVar8 = G->begin;
        iVar7 = G->end;
        pcVar9 = yy_4_primary;
        pcVar10 = "yy_4_primary";
      }
      goto LAB_00103ab2;
    }
    iVar3 = G->pos;
    iVar1 = G->thunkpos;
    iVar4 = yy_EQUAL(G);
    iVar6 = 5;
    if (iVar4 == 0) {
      G->pos = iVar3;
      G->thunkpos = iVar1;
      iVar6 = 0;
    }
    if (iVar6 == 5) goto LAB_001038a4;
    if (iVar6 == 0) {
      iVar8 = G->begin;
      iVar7 = G->end;
      pcVar9 = yy_3_primary;
      pcVar10 = "yy_3_primary";
      goto LAB_00103ab2;
    }
  }
  else {
    yyDo(G,yy_1_primary,G->begin,G->end,"yy_1_primary");
    iVar3 = G->pos;
    iVar1 = G->thunkpos;
    iVar4 = yymatchChar(G,0x3a);
    if (iVar4 == 0) {
      G->pos = iVar3;
      G->thunkpos = iVar1;
      goto LAB_00103849;
    }
    yy__(G);
    iVar3 = yy_identifier(G);
    if (iVar3 == 0) goto LAB_00103849;
    iVar3 = G->pos;
    iVar1 = G->thunkpos;
    iVar4 = yy_EQUAL(G);
    if (iVar4 != 0) goto LAB_00103849;
    G->pos = iVar3;
    G->thunkpos = iVar1;
    iVar8 = G->begin;
    iVar7 = G->end;
    pcVar9 = yy_2_primary;
    pcVar10 = "yy_2_primary";
LAB_00103ab2:
    yyDo(G,pcVar9,iVar8,iVar7,pcVar10);
  }
LAB_00103aba:
  iVar8 = G->pos;
  iVar7 = G->thunkpos;
  iVar3 = yymatchString(G,"~{");
  if (iVar3 != 0) {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    do {
      iVar3 = G->pos;
      iVar1 = G->thunkpos;
      iVar4 = yy_braces(G);
    } while (iVar4 != 0);
    G->pos = iVar3;
    G->thunkpos = iVar1;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    iVar3 = yymatchChar(G,0x7d);
    if (iVar3 != 0) {
      yy__(G);
      yyDo(G,yy_10_primary,G->begin,G->end,"yy_10_primary");
      goto LAB_00103b56;
    }
  }
  G->pos = iVar8;
  G->thunkpos = iVar7;
LAB_00103b56:
  iVar8 = G->pos;
  iVar7 = G->thunkpos;
  iVar3 = yymatchChar(G,0x3f);
  if (iVar3 == 0) {
    G->pos = iVar8;
    G->thunkpos = iVar7;
    G->pos = iVar8;
    G->thunkpos = iVar7;
    iVar3 = yymatchChar(G,0x2a);
    if (iVar3 == 0) {
      G->pos = iVar8;
      G->thunkpos = iVar7;
      G->pos = iVar8;
      G->thunkpos = iVar7;
      iVar3 = yymatchChar(G,0x2b);
      if (iVar3 == 0) {
        G->pos = iVar8;
        G->thunkpos = iVar7;
        G->pos = iVar8;
        G->thunkpos = iVar7;
        return 1;
      }
      yy__(G);
      iVar8 = G->begin;
      iVar7 = G->end;
      pcVar9 = yy_3_suffix;
      pcVar10 = "yy_3_suffix";
    }
    else {
      yy__(G);
      iVar8 = G->begin;
      iVar7 = G->end;
      pcVar9 = yy_2_suffix;
      pcVar10 = "yy_2_suffix";
    }
  }
  else {
    yy__(G);
    iVar8 = G->begin;
    iVar7 = G->end;
    pcVar9 = yy_1_suffix;
    pcVar10 = "yy_1_suffix";
  }
  yyDo(G,pcVar9,iVar8,iVar7,pcVar10);
  return 1;
}

Assistant:

YY_RULE(int) yy_suffix(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "suffix"));
  if (!yy_primary(G))  goto l71;

  {  int yypos72= G->pos, yythunkpos72= G->thunkpos;
  {  int yypos74= G->pos, yythunkpos74= G->thunkpos;  if (!yy_QUESTION(G))  goto l75;
  yyDo(G, yy_1_suffix, G->begin, G->end, "yy_1_suffix");
  goto l74;
  l75:;	  G->pos= yypos74; G->thunkpos= yythunkpos74;  if (!yy_STAR(G))  goto l76;
  yyDo(G, yy_2_suffix, G->begin, G->end, "yy_2_suffix");
  goto l74;
  l76:;	  G->pos= yypos74; G->thunkpos= yythunkpos74;  if (!yy_PLUS(G))  goto l72;
  yyDo(G, yy_3_suffix, G->begin, G->end, "yy_3_suffix");

  }
  l74:;	  goto l73;
  l72:;	  G->pos= yypos72; G->thunkpos= yythunkpos72;
  }
  l73:;	  yyprintf((stderr, "  ok   suffix"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l71:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "suffix"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}